

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous_namespace)::Counts,(wasm::
Mutability)0,wasm::InsertOrderedMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm
::Function*,wasm::ModuleUtils::(anonymous_namespace)::Counts&)>)::Mapper::doWalkFunction(wasm::
Function__(void *this,Function *curr)

{
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *this_00;
  long *plVar1;
  Function *pFVar2;
  Counts *pCVar3;
  ulong uVar4;
  __hash_code __code;
  Function *local_20;
  
  this_00 = *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
              **)((long)this + 0x110);
  uVar4 = (ulong)curr % *(ulong *)(this_00 + 8);
  plVar1 = *(long **)(*(long *)this_00 + uVar4 * 8);
  if (plVar1 != (long *)0x0) {
    plVar1 = (long *)*plVar1;
    pFVar2 = (Function *)plVar1[1];
    do {
      if (pFVar2 == curr) {
        pCVar3 = InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
                 ::operator[](this_00,(Function **)curr);
        local_20 = curr;
        if (*(long *)((long)this + 0x128) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)((long)this + 0x130))((long)this + 0x118,&local_20,pCVar3);
        return;
      }
      plVar1 = (long *)*plVar1;
    } while ((plVar1 != (long *)0x0) &&
            (pFVar2 = (Function *)plVar1[1], (ulong)pFVar2 % *(ulong *)(this_00 + 8) == uVar4));
  }
  __assert_fail("map.count(curr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/module-utils.h"
                ,0x192,
                "void wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::ModuleUtils::(anonymous namespace)::Counts, wasm::Immutable, wasm::InsertOrderedMap>::ParallelFunctionAnalysis(Module &, Func)::Mapper::doWalkFunction(Function *) [T = wasm::ModuleUtils::(anonymous namespace)::Counts, Mut = wasm::Immutable, MapT = wasm::InsertOrderedMap]"
               );
}

Assistant:

void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }